

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  bool bVar2;
  Bucket *lt_00;
  Relations local_30;
  
  while( true ) {
    while (lt_00 = lt, type == PT) {
      prVar1 = (lt_00->relatedBuckets)._M_elems[10].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      type = EQ;
      if (prVar1 == (lt_00->relatedBuckets)._M_elems[10].vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00139d2e;
      maybeBetween = (Relations *)0x0;
      lt = prVar1->_M_data;
    }
    if (type < PT) break;
    if (type != PF) {
      abort();
    }
    type = dg::vr::Relations::inverted(PF);
    maybeBetween = (Relations *)0x0;
    lt = rt;
    rt = lt_00;
  }
  local_30 = fromMaybeBetween(this,lt_00,rt,maybeBetween);
  bVar2 = Relations::conflictsWith(&local_30,type);
  type = (Type)bVar2;
LAB_00139d2e:
  return SUB41(type,0);
}

Assistant:

bool haveConflictingRelation(const Bucket &lt, Relations::Type type,
                                 const Bucket &rt,
                                 Relations *maybeBetween = nullptr) const {
        switch (type) {
        case Relations::EQ:
        case Relations::NE:
        case Relations::SLT:
        case Relations::SLE:
        case Relations::ULT:
        case Relations::ULE:
        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE: {
            Relations between = fromMaybeBetween(lt, rt, maybeBetween);
            return between.conflictsWith(type);
        }
        case Relations::PT:
            return lt.hasRelation(type) &&
                   haveConflictingRelation(lt.getRelated(type), Relations::EQ,
                                           rt);
        case Relations::PF:
            return haveConflictingRelation(rt, Relations::inverted(type), lt);
        }
        assert(0 && "unreachable");
        abort();
    }